

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void SetTextureWrap(Texture2D texture,int wrap)

{
  int wrap_local;
  
  switch(wrap) {
  case 0:
    rlTextureParameters(texture.id,0x2802,0x2901);
    rlTextureParameters(texture.id,0x2803,0x2901);
    break;
  case 1:
    rlTextureParameters(texture.id,0x2802,0x812f);
    rlTextureParameters(texture.id,0x2803,0x812f);
    break;
  case 2:
    rlTextureParameters(texture.id,0x2802,0x8370);
    rlTextureParameters(texture.id,0x2803,0x8370);
    break;
  case 3:
    rlTextureParameters(texture.id,0x2802,0x8742);
    rlTextureParameters(texture.id,0x2803,0x8742);
  }
  return;
}

Assistant:

void SetTextureWrap(Texture2D texture, int wrap)
{
    switch (wrap)
    {
        case TEXTURE_WRAP_REPEAT:
        {
            rlTextureParameters(texture.id, RL_TEXTURE_WRAP_S, RL_TEXTURE_WRAP_REPEAT);
            rlTextureParameters(texture.id, RL_TEXTURE_WRAP_T, RL_TEXTURE_WRAP_REPEAT);
        } break;
        case TEXTURE_WRAP_CLAMP:
        {
            rlTextureParameters(texture.id, RL_TEXTURE_WRAP_S, RL_TEXTURE_WRAP_CLAMP);
            rlTextureParameters(texture.id, RL_TEXTURE_WRAP_T, RL_TEXTURE_WRAP_CLAMP);
        } break;
        case TEXTURE_WRAP_MIRROR_REPEAT:
        {
            rlTextureParameters(texture.id, RL_TEXTURE_WRAP_S, RL_TEXTURE_WRAP_MIRROR_REPEAT);
            rlTextureParameters(texture.id, RL_TEXTURE_WRAP_T, RL_TEXTURE_WRAP_MIRROR_REPEAT);
        } break;
        case TEXTURE_WRAP_MIRROR_CLAMP:
        {
            rlTextureParameters(texture.id, RL_TEXTURE_WRAP_S, RL_TEXTURE_WRAP_MIRROR_CLAMP);
            rlTextureParameters(texture.id, RL_TEXTURE_WRAP_T, RL_TEXTURE_WRAP_MIRROR_CLAMP);
        } break;
        default: break;
    }
}